

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O1

int lytype_store(lys_module *mod,char *type_name,char **value_str,lyd_val *value)

{
  int iVar1;
  lytype_plugin_list *plVar2;
  lys_revision *revision;
  char *local_30;
  char *err_msg;
  
  local_30 = (char *)0x0;
  if ((((mod == (lys_module *)0x0) || (type_name == (char *)0x0)) || (value_str == (char **)0x0)) ||
     (value == (lyd_val *)0x0)) {
    __assert_fail("mod && type_name && value_str && value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/plugins.c"
                  ,0x254,
                  "int lytype_store(const struct lys_module *, const char *, const char **, lyd_val *)"
                 );
  }
  if (mod->rev_size == '\0') {
    revision = (lys_revision *)0x0;
  }
  else {
    revision = mod->rev;
  }
  plVar2 = lytype_find(mod->name,revision->date,type_name);
  if (plVar2 != (lytype_plugin_list *)0x0) {
    iVar1 = (*plVar2->store_clb)(mod->ctx,type_name,value_str,value,&local_30);
    if (iVar1 != 0) {
      if ((local_30 == (char *)0x0) &&
         (iVar1 = asprintf(&local_30,"Failed to store value \"%s\" of user type \"%s\".",*value_str,
                           type_name), iVar1 == -1)) {
        ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lytype_store");
      }
      else {
        ly_log(mod->ctx,LY_LLERR,LY_EPLUGIN,local_30);
        free(local_30);
      }
      return -1;
    }
    return 0;
  }
  return 1;
}

Assistant:

int
lytype_store(const struct lys_module *mod, const char *type_name, const char **value_str, lyd_val *value)
{
    struct lytype_plugin_list *p;
    char *err_msg = NULL;

    assert(mod && type_name && value_str && value);

    p = lytype_find(mod->name, mod->rev_size ? mod->rev[0].date : NULL, type_name);
    if (p) {
        if (p->store_clb(mod->ctx, type_name, value_str, value, &err_msg)) {
            if (!err_msg) {
                if (asprintf(&err_msg, "Failed to store value \"%s\" of user type \"%s\".", *value_str, type_name) == -1) {
                    LOGMEM(mod->ctx);
                    return -1;
                }
            }
            LOGERR(mod->ctx, LY_EPLUGIN, err_msg);
            free(err_msg);
            return -1;
        }

        /* value successfully stored */
        return 0;
    }

    return 1;
}